

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O3

string * __thiscall
CLOptions::operator[](string *__return_storage_ptr__,CLOptions *this,string *param_name)

{
  pointer pcVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  mapped_type *ppCVar4;
  const_iterator cVar5;
  mapped_type *ppCVar6;
  const_iterator cVar7;
  mapped_type *ppCVar8;
  ostream *poVar9;
  stringstream param_val;
  char *local_1c8;
  long local_1c0;
  char local_1b8 [16];
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
          ::find(&(this->params_bools)._M_t,param_name);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->params_bools)._M_t._M_impl.super__Rb_tree_header)
  {
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
            ::find(&(this->params_doubles)._M_t,param_name);
    if ((_Rb_tree_header *)cVar3._M_node ==
        &(this->params_doubles)._M_t._M_impl.super__Rb_tree_header) {
      cVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
              ::find(&(this->params_ints)._M_t,param_name);
      if ((_Rb_tree_header *)cVar5._M_node ==
          &(this->params_ints)._M_t._M_impl.super__Rb_tree_header) {
        cVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
                ::find(&(this->params_strings)._M_t,param_name);
        if ((_Rb_tree_header *)cVar7._M_node ==
            &(this->params_strings)._M_t._M_impl.super__Rb_tree_header) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"[ERROR] Unknown command line parameter: ",0x28);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(param_name->_M_dataplus)._M_p,
                              param_name->_M_string_length);
          std::endl<char,std::char_traits<char>>(poVar9);
        }
        else {
          ppCVar8 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
                    ::operator[](&this->params_strings,param_name);
          pcVar1 = ((*ppCVar8)->
                   super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ).value._M_dataplus._M_p;
          local_1c8 = local_1b8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1c8,pcVar1,
                     pcVar1 + ((*ppCVar8)->
                              super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ).value._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(local_198,local_1c8,local_1c0);
          if (local_1c8 != local_1b8) {
            operator_delete(local_1c8);
          }
        }
      }
      else {
        ppCVar6 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
                  ::operator[](&this->params_ints,param_name);
        std::ostream::operator<<(local_198,*(int *)(*ppCVar6 + 0x50));
      }
    }
    else {
      ppCVar4 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
                ::operator[](&this->params_doubles,param_name);
      std::ostream::_M_insert<double>(((*ppCVar4)->super_CLParam<double>).value);
    }
  }
  else {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
    ::operator[](&this->params_bools,param_name);
    std::ostream::_M_insert<bool>(SUB81(local_198,0));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string CLOptions::operator[](std::string param_name)
{
    // Create a default return value of an empty string
    std::stringstream param_val ;
    
    // Loop through the bools
    if (params_bools.count(param_name) > 0) {
        param_val << params_bools[param_name]->getValue() ;
    }
    
    // Loop through the doubles
    else if (params_doubles.count(param_name) > 0) {
        param_val << params_doubles[param_name]->getValue() ;
    }
    
    // Loop through the ints
    else if (params_ints.count(param_name) > 0) {
        param_val << params_ints[param_name]->getValue() ;
    }
    
    // Loop through the strings
    else if (params_strings.count(param_name) > 0) {
        param_val << params_strings[param_name]->getValue() ;
    }
    
    else {
        std::cerr << "[ERROR] Unknown command line parameter: " << param_name << std::endl;
    }
    
    return param_val.str() ;
}